

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt2obj.cpp
# Opt level: O0

void pbrt::writeTriangleMesh(SP *mesh,affine3f *xfm)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  element_type *peVar5;
  reference pvVar6;
  ostream *poVar7;
  void *pvVar8;
  __normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
  *in_RDI;
  vec3f vVar9;
  vec3i v_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *__range1_1;
  vec3f v;
  iterator __end1;
  iterator __begin1;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *__range1;
  size_t firstVertexID;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *in_stack_ffffffffffffff68;
  int local_84;
  int iStack_80;
  vec3f *in_stack_ffffffffffffff88;
  __normal_iterator<pbrt::math::vec3i_*,_std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>_>
  in_stack_ffffffffffffff90;
  float local_58;
  float local_40;
  float fStack_3c;
  __normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
  local_28;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *local_20;
  long local_18;
  
  local_18 = numVerticesWritten + 1;
  peVar5 = std::__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x10cda4);
  local_20 = &peVar5->vertex;
  local_28._M_current =
       (vec3f *)std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::begin
                          (in_stack_ffffffffffffff68);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::end(in_stack_ffffffffffffff68)
  ;
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
                               *)in_stack_ffffffffffffff68);
    if (!bVar4) break;
    __gnu_cxx::
    __normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
    ::operator*(&local_28);
    vVar9 = math::xfmPoint((affine3f *)in_stack_ffffffffffffff90._M_current,
                           in_stack_ffffffffffffff88);
    local_58 = vVar9.z;
    poVar7 = std::operator<<((ostream *)out,"v  ");
    local_40 = vVar9.x;
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_40);
    poVar7 = std::operator<<(poVar7," ");
    fStack_3c = vVar9.y;
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,fStack_3c);
    poVar7 = std::operator<<(poVar7," ");
    pvVar8 = (void *)std::ostream::operator<<(poVar7,local_58);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    numVerticesWritten = numVerticesWritten + 1;
    __gnu_cxx::
    __normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
    ::operator++(&local_28);
  }
  std::__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x10ced3);
  std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::begin
            ((vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *)
             in_stack_ffffffffffffff68);
  std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::end
            ((vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *)
             in_stack_ffffffffffffff68);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      ((__normal_iterator<pbrt::math::vec3i_*,_std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>_>
                        *)in_RDI,
                       (__normal_iterator<pbrt::math::vec3i_*,_std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar4) break;
    pvVar6 = __gnu_cxx::
             __normal_iterator<pbrt::math::vec3i_*,_std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>_>
             ::operator*((__normal_iterator<pbrt::math::vec3i_*,_std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>_>
                          *)&stack0xffffffffffffff90);
    uVar2 = pvVar6->x;
    uVar3 = pvVar6->y;
    iVar1 = pvVar6->z;
    poVar7 = std::operator<<((ostream *)out,"f ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_18 + (int)uVar2);
    poVar7 = std::operator<<(poVar7,"\t");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_18 + (int)uVar3);
    poVar7 = std::operator<<(poVar7,"\t");
    pvVar8 = (void *)std::ostream::operator<<(poVar7,local_18 + iVar1);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<pbrt::math::vec3i_*,_std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>_>
    ::operator++((__normal_iterator<pbrt::math::vec3i_*,_std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>_>
                  *)&stack0xffffffffffffff90);
  }
  numWritten = numWritten + 1;
  return;
}

Assistant:

void writeTriangleMesh(TriangleMesh::SP mesh, const affine3f &xfm)
  {
    /* TODO: export the material of that shape, and use it */
    size_t firstVertexID = numVerticesWritten+1;

    /* TODO: ignoring texture coordinates for now */

    /* TODO: ignoring shading normals for now */

    for (auto v : mesh->vertex) {
      v = xfmPoint(xfm,v);
      out << "v  " << v.x << " " << v.y << " " << v.z << std::endl;
      numVerticesWritten++;
    }

    for (auto v : mesh->index) {
      /* TODO : for texcoord and normal arrays, use x//x an x/x/x formats */
      out << "f " << (firstVertexID+v.x)
          << "\t" << (firstVertexID+v.y)
          << "\t" << (firstVertexID+v.z)
          << std::endl;
    }
    numWritten++;
  }